

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

int LZ4_compress_fast_force(char *src,char *dst,int srcSize,int dstCapacity,int acceleration)

{
  ulong *puVar1;
  short sVar2;
  char cVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  long *plVar8;
  long *plVar9;
  char cVar10;
  uint uVar11;
  ulong *puVar12;
  int *piVar13;
  int *piVar14;
  char *pcVar15;
  ushort uVar16;
  ulong *puVar17;
  BYTE *s;
  ulong *puVar18;
  int iVar19;
  int iVar20;
  long *plVar21;
  long lVar22;
  short *psVar23;
  short *psVar24;
  char *__s;
  long *plVar25;
  BYTE *s_1;
  long *__src;
  uint uVar26;
  int iVar27;
  BYTE *e_1;
  long lVar28;
  int *piVar29;
  uint uVar30;
  BYTE *e;
  short *local_40c0;
  int local_4080;
  LZ4_stream_t ctx;
  
  memset(&ctx,0,0x4020);
  pcVar7 = dst + dstCapacity;
  ctx.internal_donotuse.currentOffset = srcSize;
  ctx.internal_donotuse.dictSize = srcSize;
  if (0x1000a < srcSize) {
    if (0x7e000000 < (uint)srcSize) {
      return 0;
    }
    plVar25 = (long *)(src + ((ulong)(uint)srcSize - 0xb));
    ctx.internal_donotuse.tableType = 2;
    *(undefined4 *)((long)&ctx + ((ulong)(*(long *)src * -0x30e4432345000000) >> 0x34) * 4) = 0;
    plVar8 = (long *)(src + 2);
    puVar1 = (ulong *)(src + ((ulong)(uint)srcSize - 0xc));
    pcVar15 = dst;
    __src = (long *)src;
LAB_001058df:
    lVar28 = *(long *)((long)__src + 1);
    plVar21 = (long *)((long)__src + 1);
    iVar27 = acceleration << 6;
    while( true ) {
      uVar4 = (ulong)(lVar28 * -0x30e4432345000000) >> 0x34;
      uVar26 = *(uint *)((long)&ctx + uVar4 * 4);
      uVar5 = (ulong)uVar26;
      iVar19 = (int)plVar21;
      iVar20 = (int)src;
      lVar28 = *plVar8;
      *(int *)((long)&ctx + uVar4 * 4) = iVar19 - iVar20;
      if (((uint)(iVar19 - iVar20) <= uVar26 + 0xffff) && (*(int *)(src + uVar5) == (int)*plVar21))
      break;
      plVar9 = (long *)((long)(iVar27 >> 6) + (long)plVar8);
      iVar27 = iVar27 + 1;
      plVar21 = plVar8;
      plVar8 = plVar9;
      if (plVar25 < plVar9) goto LAB_00106155;
    }
    uVar11 = iVar19 - (int)__src;
    lVar28 = 0;
    uVar26 = uVar11 - 0xf;
    cVar3 = (char)plVar21 * '\x10' + (char)__src * -0x10;
    do {
      cVar10 = cVar3;
      uVar30 = uVar26;
      lVar22 = lVar28;
      piVar29 = (int *)(src + lVar22 + uVar5);
      plVar8 = (long *)((long)plVar21 + lVar22);
      if ((piVar29 <= src) || (plVar8 <= __src)) break;
      lVar28 = lVar22 + -1;
      uVar26 = uVar30 - 1;
      cVar3 = cVar10 + -0x10;
    } while (*(char *)((long)plVar21 + lVar22 + -1) == src[lVar22 + (uVar5 - 1)]);
    iVar27 = (int)lVar22;
    uVar5 = (ulong)(uint)(iVar27 + (iVar19 - (int)__src));
    if (pcVar7 < pcVar15 + ((ulong)uVar11 + lVar22 & 0xffffffff) / 0xff + uVar5 + 9) {
      return 0;
    }
    plVar21 = (long *)(pcVar15 + 1);
    if ((uint)((ulong)uVar11 + lVar22) < 0xf) {
      *pcVar15 = cVar10;
    }
    else {
      uVar4 = (ulong)(uVar11 - 0xf) + lVar22;
      *pcVar15 = -0x10;
      if (0xfe < (int)uVar4) {
        uVar26 = 0x1fd;
        if (uVar30 < 0x1fd) {
          uVar26 = uVar30;
        }
        if (0x1fc < (int)uVar30) {
          uVar30 = 0x1fd;
        }
        memset(plVar21,0xff,(ulong)((((uVar11 + 0xef) - uVar26) + iVar27) / 0xff + 1));
        uVar26 = ((uVar11 + 0xef) - uVar30) + iVar27;
        plVar21 = (long *)(pcVar15 + (ulong)uVar26 / 0xff + 2);
        uVar4 = (ulong)((uVar11 - 0x10e) + iVar27 + (uVar26 % 0xff - uVar26));
      }
      *(char *)plVar21 = (char)uVar4;
      plVar21 = (long *)((long)plVar21 + 1);
    }
    plVar9 = (long *)(uVar5 + (long)plVar21);
    do {
      *plVar21 = *__src;
      plVar21 = plVar21 + 1;
      __src = __src + 1;
    } while (plVar21 < plVar9);
    do {
      *(short *)plVar9 = (short)plVar8 - (short)piVar29;
      puVar17 = (ulong *)((long)plVar8 + 4);
      puVar12 = (ulong *)(piVar29 + 1);
      puVar18 = puVar17;
      if (puVar17 < puVar1) {
        if (*puVar12 == *puVar17) {
          puVar12 = (ulong *)(piVar29 + 3);
          puVar18 = (ulong *)((long)plVar8 + 0xc);
          goto LAB_00105adf;
        }
        uVar5 = *puVar17 ^ *puVar12;
        lVar28 = 0;
        if (uVar5 != 0) {
          for (; (uVar5 >> lVar28 & 1) == 0; lVar28 = lVar28 + 1) {
          }
        }
        uVar26 = (uint)lVar28 >> 3;
      }
      else {
LAB_00105adf:
        if (puVar18 < puVar1) {
          iVar27 = ((int)puVar18 - (int)plVar8) + -4;
LAB_00105aec:
          if (*puVar12 == *puVar18) goto code_r0x00105af8;
          uVar4 = *puVar18 ^ *puVar12;
          uVar5 = 0;
          if (uVar4 != 0) {
            for (; (uVar4 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
            }
          }
          uVar26 = ((uint)(uVar5 >> 3) & 0x1fffffff) + iVar27;
          goto LAB_00105b67;
        }
LAB_00105b08:
        if ((puVar18 < src + ((ulong)(uint)srcSize - 8)) && ((int)*puVar12 == (int)*puVar18)) {
          puVar18 = (ulong *)((long)puVar18 + 4);
          puVar12 = (ulong *)((long)puVar12 + 4);
        }
        if ((puVar18 < src + ((ulong)(uint)srcSize - 6)) && ((short)*puVar12 == (short)*puVar18)) {
          puVar18 = (ulong *)((long)puVar18 + 2);
          puVar12 = (ulong *)((long)puVar12 + 2);
        }
        if (puVar18 < src + ((ulong)(uint)srcSize - 5)) {
          puVar18 = (ulong *)((long)puVar18 + (ulong)((char)*puVar12 == (char)*puVar18));
        }
        uVar26 = (int)puVar18 - (int)puVar17;
      }
LAB_00105b67:
      if (pcVar7 < (char *)((long)plVar9 + (ulong)(uVar26 + 0xf0) / 0xff + 8)) {
        return 0;
      }
      pcVar6 = (char *)((long)plVar9 + 2);
      if (uVar26 < 0xf) {
        *pcVar15 = *pcVar15 + (char)uVar26;
        pcVar15 = pcVar6;
      }
      else {
        *pcVar15 = *pcVar15 + '\x0f';
        uVar16 = (ushort)(uVar26 - 0xf);
        pcVar6[0] = -1;
        pcVar6[1] = -1;
        pcVar6[2] = -1;
        pcVar6[3] = -1;
        if (0x3fb < uVar26 - 0xf) {
          uVar16 = (ushort)((ulong)(uVar26 - 0x40b) % 0x3fc);
          uVar5 = (ulong)((uVar26 - 0x40b) / 0x3fc << 2);
          memset((char *)((long)plVar9 + 6),0xff,uVar5 + 4);
          pcVar6 = (char *)((long)plVar9 + uVar5 + 6);
        }
        pcVar6[uVar16 / 0xff] = (char)((uint)uVar16 % 0xff);
        pcVar15 = pcVar6 + uVar16 / 0xff + 1;
      }
      lVar28 = (long)plVar8 + (ulong)uVar26;
      __src = (long *)(lVar28 + 4);
      if (plVar25 <= __src) goto LAB_00106155;
      *(int *)((long)&ctx + ((ulong)(*(long *)(lVar28 + 2) * -0x30e4432345000000) >> 0x34) * 4) =
           ((int)lVar28 + 2) - iVar20;
      uVar5 = (ulong)(*__src * -0x30e4432345000000) >> 0x34;
      uVar11 = (int)__src - iVar20;
      uVar26 = *(uint *)((long)&ctx + uVar5 * 4);
      *(uint *)((long)&ctx + uVar5 * 4) = uVar11;
      if ((uVar26 + 0xffff < uVar11) || (piVar29 = (int *)(src + uVar26), *piVar29 != *(int *)__src)
         ) goto LAB_00105c82;
      plVar9 = (long *)(pcVar15 + 1);
      *pcVar15 = '\0';
      plVar8 = __src;
    } while( true );
  }
  if (0x7e000000 < (uint)srcSize) {
    return 0;
  }
  ctx.internal_donotuse.tableType = 3;
  psVar23 = (short *)dst;
  piVar29 = (int *)src;
  if (0xc < (uint)srcSize) {
    *(undefined2 *)((long)&ctx + (ulong)((uint)(*(int *)src * -0x61c8864f) >> 0x13) * 2) = 0;
    puVar1 = (ulong *)(src + (long)srcSize + -0xc);
    local_40c0 = (short *)dst;
LAB_00105cfd:
    iVar20 = 1;
    iVar27 = *(int *)((long)piVar29 + 1);
    piVar14 = (int *)((long)piVar29 + 1);
    iVar19 = acceleration << 6;
    do {
      piVar13 = piVar14;
      piVar14 = (int *)((long)iVar20 + (long)piVar13);
      psVar23 = local_40c0;
      if (src + (long)srcSize + -0xb < piVar14) goto LAB_0010609f;
      iVar20 = iVar19 >> 6;
      iVar19 = iVar19 + 1;
      uVar4 = (ulong)((uint)(iVar27 * -0x61c8864f) >> 0x13);
      uVar5 = (ulong)*(ushort *)((long)&ctx + uVar4 * 2);
      sVar2 = (short)src;
      iVar27 = *piVar14;
      *(short *)((long)&ctx + uVar4 * 2) = (short)piVar13 - sVar2;
    } while (*(int *)(src + uVar5) != *piVar13);
    uVar11 = (int)piVar13 - (int)piVar29;
    lVar28 = 0;
    uVar26 = uVar11 - 0xf;
    cVar3 = (char)piVar13 * '\x10' + (char)piVar29 * -0x10;
    do {
      cVar10 = cVar3;
      uVar30 = uVar26;
      lVar22 = lVar28;
      pcVar15 = src + lVar22 + uVar5;
      piVar14 = (int *)((long)piVar13 + lVar22);
      if ((pcVar15 <= src) || (piVar14 <= piVar29)) break;
      lVar28 = lVar22 + -1;
      uVar26 = uVar30 - 1;
      cVar3 = cVar10 + -0x10;
    } while (*(char *)((long)piVar13 + lVar22 + -1) == src[lVar22 + (uVar5 - 1)]);
    iVar27 = (int)lVar22;
    uVar5 = (ulong)(uint)(iVar27 + ((int)piVar13 - (int)piVar29));
    if (pcVar7 < (char *)((long)local_40c0 +
                         ((ulong)uVar11 + lVar22 & 0xffffffff) / 0xff + uVar5 + 9)) {
      return 0;
    }
    psVar23 = (short *)((long)local_40c0 + 1);
    if ((uint)((ulong)uVar11 + lVar22) < 0xf) {
      *(char *)local_40c0 = cVar10;
    }
    else {
      uVar4 = (ulong)(uVar11 - 0xf) + lVar22;
      *(char *)local_40c0 = -0x10;
      if (0xfe < (int)uVar4) {
        uVar26 = 0x1fd;
        if (uVar30 < 0x1fd) {
          uVar26 = uVar30;
        }
        if (0x1fc < (int)uVar30) {
          uVar30 = 0x1fd;
        }
        memset(psVar23,0xff,(ulong)((((uVar11 + 0xef) - uVar26) + iVar27) / 0xff + 1));
        uVar26 = ((uVar11 + 0xef) - uVar30) + iVar27;
        psVar23 = (short *)((long)local_40c0 + (ulong)uVar26 / 0xff + 2);
        uVar4 = (ulong)((uVar11 - 0x10e) + iVar27 + (uVar26 % 0xff - uVar26));
      }
      *(char *)psVar23 = (char)uVar4;
      psVar23 = (short *)((long)psVar23 + 1);
    }
    psVar24 = (short *)(uVar5 + (long)psVar23);
    do {
      *(undefined8 *)psVar23 = *(undefined8 *)piVar29;
      psVar23 = psVar23 + 4;
      piVar29 = piVar29 + 2;
    } while (psVar23 < psVar24);
    do {
      *psVar24 = (short)piVar14 - (short)pcVar15;
      puVar12 = (ulong *)(piVar14 + 1);
      puVar17 = (ulong *)(pcVar15 + 4);
      puVar18 = puVar12;
      if (puVar12 < puVar1) {
        if (*puVar17 == *puVar12) {
          puVar17 = (ulong *)(pcVar15 + 0xc);
          puVar18 = (ulong *)(piVar14 + 3);
          goto LAB_00105ee3;
        }
        uVar5 = *puVar12 ^ *puVar17;
        lVar28 = 0;
        if (uVar5 != 0) {
          for (; (uVar5 >> lVar28 & 1) == 0; lVar28 = lVar28 + 1) {
          }
        }
        uVar26 = (uint)lVar28 >> 3;
      }
      else {
LAB_00105ee3:
        if (puVar18 < puVar1) {
          iVar27 = ((int)puVar18 - (int)piVar14) + -4;
LAB_00105ef3:
          if (*puVar17 == *puVar18) goto code_r0x00105eff;
          uVar4 = *puVar18 ^ *puVar17;
          uVar5 = 0;
          if (uVar4 != 0) {
            for (; (uVar4 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
            }
          }
          uVar26 = ((uint)(uVar5 >> 3) & 0x1fffffff) + iVar27;
          goto LAB_00105f73;
        }
LAB_00105f0f:
        if ((puVar18 < src + (long)srcSize + -8) && ((int)*puVar17 == (int)*puVar18)) {
          puVar18 = (ulong *)((long)puVar18 + 4);
          puVar17 = (ulong *)((long)puVar17 + 4);
        }
        if ((puVar18 < src + (long)srcSize + -6) && ((short)*puVar17 == (short)*puVar18)) {
          puVar18 = (ulong *)((long)puVar18 + 2);
          puVar17 = (ulong *)((long)puVar17 + 2);
        }
        if (puVar18 < src + (long)srcSize + -5) {
          puVar18 = (ulong *)((long)puVar18 + (ulong)((char)*puVar17 == (char)*puVar18));
        }
        uVar26 = (int)puVar18 - (int)puVar12;
      }
LAB_00105f73:
      if (pcVar7 < (char *)((long)psVar24 + (ulong)(uVar26 + 0xf0) / 0xff + 8)) {
        return 0;
      }
      psVar23 = psVar24 + 1;
      if (uVar26 < 0xf) {
        *(char *)local_40c0 = (char)*local_40c0 + (char)uVar26;
      }
      else {
        *(char *)local_40c0 = (char)*local_40c0 + '\x0f';
        uVar16 = (ushort)(uVar26 - 0xf);
        psVar23[0] = -1;
        psVar23[1] = -1;
        if (0x3fb < uVar26 - 0xf) {
          uVar16 = (ushort)((ulong)(uVar26 - 0x40b) % 0x3fc);
          uVar5 = (ulong)((uVar26 - 0x40b) / 0x3fc << 2);
          memset(psVar24 + 3,0xff,uVar5 + 4);
          psVar23 = (short *)((long)psVar24 + uVar5 + 6);
        }
        pcVar15 = (char *)((long)psVar23 + (ulong)(uVar16 / 0xff));
        psVar23 = (short *)(pcVar15 + 1);
        *pcVar15 = (char)(uVar16 % 0xff);
      }
      lVar28 = (long)piVar14 + (ulong)uVar26;
      piVar29 = (int *)(lVar28 + 4);
      if (src + (long)srcSize + -0xb <= piVar29) break;
      *(short *)((long)&ctx + (ulong)((uint)(*(int *)(lVar28 + 2) * -0x61c8864f) >> 0x13) * 2) =
           ((short)lVar28 + 2) - sVar2;
      uVar5 = (ulong)((uint)(*piVar29 * -0x61c8864f) >> 0x13);
      uVar16 = *(ushort *)((long)&ctx + uVar5 * 2);
      pcVar15 = src + uVar16;
      *(short *)((long)&ctx + uVar5 * 2) = (short)piVar29 - sVar2;
      local_40c0 = psVar23;
      if (*(int *)(src + uVar16) != *piVar29) goto LAB_00105cfd;
      psVar24 = (short *)((long)psVar23 + 1);
      *(char *)psVar23 = '\0';
      piVar14 = piVar29;
    } while( true );
  }
LAB_0010609f:
  pcVar15 = src + ((long)srcSize - (long)piVar29);
  if (pcVar7 < (char *)((long)psVar23 + (long)(pcVar15 + (ulong)(pcVar15 + 0xf0) / 0xff + 1))) {
    return 0;
  }
  if (pcVar15 < (char *)0xf) {
    *(char *)psVar23 = (char)pcVar15 << 4;
  }
  else {
    pcVar7 = pcVar15 + -0xf;
    *(char *)psVar23 = -0x10;
    psVar24 = (short *)((long)psVar23 + 1);
    if ((char *)0xfe < pcVar7) {
      uVar5 = (ulong)(pcVar15 + -0x10e) / 0xff;
      memset(psVar24,0xff,uVar5 + 1);
      pcVar7 = pcVar15 + uVar5 * -0xff + -0x10e;
      psVar24 = (short *)((long)psVar23 + uVar5 + 2);
    }
    *(char *)psVar24 = (char)pcVar7;
    psVar23 = psVar24;
  }
  memcpy((char *)((long)psVar23 + 1),piVar29,(size_t)pcVar15);
  iVar27 = (int)(char *)((long)psVar23 + 1) + (int)pcVar15;
LAB_001061ff:
  local_4080 = (int)dst;
  return iVar27 - local_4080;
code_r0x00105af8:
  puVar18 = puVar18 + 1;
  puVar12 = puVar12 + 1;
  iVar27 = iVar27 + 8;
  if (puVar1 <= puVar18) goto LAB_00105b08;
  goto LAB_00105aec;
LAB_00105c82:
  plVar8 = (long *)(lVar28 + 6);
  if (plVar25 < plVar8) goto LAB_00106155;
  goto LAB_001058df;
LAB_00106155:
  pcVar6 = src + ((ulong)(uint)srcSize - (long)__src);
  if (pcVar7 < pcVar15 + (long)(pcVar6 + (ulong)(pcVar6 + 0xf0) / 0xff + 1)) {
    return 0;
  }
  if (pcVar6 < (char *)0xf) {
    *pcVar15 = (char)pcVar6 << 4;
  }
  else {
    pcVar7 = pcVar6 + -0xf;
    *pcVar15 = -0x10;
    __s = pcVar15 + 1;
    if ((char *)0xfe < pcVar7) {
      uVar5 = (ulong)(pcVar6 + -0x10e) / 0xff;
      memset(__s,0xff,uVar5 + 1);
      pcVar7 = pcVar6 + uVar5 * -0xff + -0x10e;
      __s = pcVar15 + uVar5 + 2;
    }
    *__s = (char)pcVar7;
    pcVar15 = __s;
  }
  memcpy(pcVar15 + 1,__src,(size_t)pcVar6);
  iVar27 = (int)(pcVar15 + 1) + (int)pcVar6;
  goto LAB_001061ff;
code_r0x00105eff:
  puVar18 = puVar18 + 1;
  puVar17 = puVar17 + 1;
  iVar27 = iVar27 + 8;
  if (puVar1 <= puVar18) goto LAB_00105f0f;
  goto LAB_00105ef3;
}

Assistant:

int LZ4_compress_fast_force(const char* src, char* dst, int srcSize, int dstCapacity, int acceleration)
{
    LZ4_stream_t ctx;
    LZ4_initStream(&ctx, sizeof(ctx));

    if (srcSize < LZ4_64Klimit) {
        return LZ4_compress_generic(&ctx.internal_donotuse, src, dst, srcSize, NULL, dstCapacity, limitedOutput, byU16,    noDict, noDictIssue, acceleration);
    } else {
        tableType_t const addrMode = (sizeof(void*) > 4) ? byU32 : byPtr;
        return LZ4_compress_generic(&ctx.internal_donotuse, src, dst, srcSize, NULL, dstCapacity, limitedOutput, addrMode, noDict, noDictIssue, acceleration);
    }
}